

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

optional<long> __thiscall
node::anon_unknown_2::ChainImpl::calculateCombinedBumpFee
          (ChainImpl *this,vector<COutPoint,_std::allocator<COutPoint>_> *outpoints,
          CFeeRate *target_feerate)

{
  CTxMemPool *mempool;
  _Storage<long,_true> _Var1;
  ulong uVar2;
  long in_FS_OFFSET;
  optional<long> oVar3;
  MiniMiner MStack_198;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  mempool = (this->m_node->mempool)._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  if (mempool == (CTxMemPool *)0x0) {
    uVar2 = CONCAT71((int7)((ulong)target_feerate >> 8),1);
    _Var1._M_value = 0;
  }
  else {
    MiniMiner::MiniMiner(&MStack_198,mempool,outpoints);
    oVar3 = MiniMiner::CalculateTotalBumpFees(&MStack_198,target_feerate);
    _Var1._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    uVar2 = (ulong)oVar3.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._8_4_;
    MiniMiner::~MiniMiner(&MStack_198);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_
         = uVar2 & 0xffffffff;
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = _Var1._M_value;
    return (optional<long>)
           oVar3.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<CAmount> calculateCombinedBumpFee(const std::vector<COutPoint>& outpoints, const CFeeRate& target_feerate) override
    {
        if (!m_node.mempool) {
            return 0;
        }
        return MiniMiner(*m_node.mempool, outpoints).CalculateTotalBumpFees(target_feerate);
    }